

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

IPAsKeyLRU * __thiscall LruHash<IPAsKeyLRU>::Remove(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key)

{
  IPAsKeyLRU *pIVar1;
  IPAsKeyLRU *pIVar2;
  IPAsKeyLRU *pIVar3;
  LruHash<IPAsKeyLRU> *pLVar4;
  IPAsKeyLRU **ppIVar5;
  
  pIVar3 = BinHash<IPAsKeyLRU>::Remove(&this->binHash,key);
  if (pIVar3 != (IPAsKeyLRU *)0x0) {
    pIVar1 = pIVar3->MoreRecentKey;
    pIVar2 = pIVar3->LessRecentKey;
    pLVar4 = (LruHash<IPAsKeyLRU> *)&pIVar1->LessRecentKey;
    if (pIVar1 == (IPAsKeyLRU *)0x0) {
      pLVar4 = this;
    }
    ppIVar5 = &pIVar2->MoreRecentKey;
    if (pIVar2 == (IPAsKeyLRU *)0x0) {
      ppIVar5 = &this->LeastRecentlyUsed;
    }
    pLVar4->MostRecentlyUsed = pIVar2;
    *ppIVar5 = pIVar1;
    pIVar3->MoreRecentKey = (IPAsKeyLRU *)0x0;
    pIVar3->LessRecentKey = (IPAsKeyLRU *)0x0;
  }
  return pIVar3;
}

Assistant:

KeyObj * Remove(KeyObj * key)
    {
        KeyObj * retKey = binHash.Remove(key);

        if (retKey != NULL)
        {
            LruUnlink(retKey);
        }

        return retKey;
    }